

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmsio.c
# Opt level: O3

int FmsIODestroyFmsIODataCollectionInfo(FmsIODataCollectionInfo *dc_info)

{
  FmsIODomainInfo *pFVar1;
  FmsInt FVar2;
  void *pvVar3;
  FmsIOComponentInfo *pFVar4;
  FmsIOComponentPartInfo *pFVar5;
  FmsIOTagInfo *pFVar6;
  FmsIOFieldInfo *pFVar7;
  FmsIOMetaDataInfo *minfo;
  int in_EAX;
  int extraout_EAX;
  FmsIODomainNameInfo *pFVar8;
  FmsInt FVar9;
  FmsInt FVar10;
  FmsInt FVar11;
  FmsIOMeshInfo *__ptr;
  FmsInt FVar12;
  long lVar13;
  long lVar14;
  
  if (dc_info == (FmsIODataCollectionInfo *)0x0) {
    return in_EAX;
  }
  __ptr = dc_info->mesh_info;
  FVar12 = __ptr->ndomain_names;
  if (FVar12 != 0) {
    FVar10 = 0;
    do {
      pFVar8 = dc_info->mesh_info->domain_names;
      FVar2 = pFVar8[FVar10].ndomains;
      if (FVar2 != 0) {
        FVar11 = 0;
        do {
          pFVar1 = dc_info->mesh_info->domain_names[FVar10].domains + FVar11;
          FVar9 = pFVar1->dim;
          if (FVar9 != 0) {
            lVar13 = 0x20;
            do {
              pvVar3 = *(void **)((long)&pFVar1->entities->ent_type + lVar13);
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
              lVar13 = lVar13 + 0x28;
              FVar9 = FVar9 - 1;
            } while (FVar9 != 0);
          }
          if (pFVar1->entities != (FmsIOEntityInfo *)0x0) {
            free(pFVar1->entities);
          }
          FVar11 = FVar11 + 1;
        } while (FVar11 != FVar2);
        pFVar8 = dc_info->mesh_info->domain_names;
      }
      if (pFVar8[FVar10].domains != (FmsIODomainInfo *)0x0) {
        free(pFVar8[FVar10].domains);
      }
      FVar10 = FVar10 + 1;
    } while (FVar10 != FVar12);
    __ptr = dc_info->mesh_info;
    if (__ptr->domain_names != (FmsIODomainNameInfo *)0x0) {
      free(__ptr->domain_names);
      __ptr = dc_info->mesh_info;
    }
  }
  FVar12 = __ptr->ncomponents;
  if (FVar12 != 0) {
    FVar10 = 0;
    do {
      pFVar4 = dc_info->mesh_info->components;
      FVar2 = pFVar4[FVar10].nparts;
      if (FVar2 != 0) {
        lVar13 = 0;
        FVar11 = 0;
        do {
          pFVar5 = pFVar4[FVar10].parts;
          lVar14 = 0x40;
          do {
            if ((*(long *)((long)pFVar5->entities + lVar14 + lVar13 + -0x38) != 0) &&
               (pvVar3 = *(void **)((long)pFVar5->entities + lVar14 + lVar13 + -0x20),
               pvVar3 != (void *)0x0)) {
              free(pvVar3);
            }
            lVar14 = lVar14 + 0x28;
          } while (lVar14 != 0x180);
          FVar11 = FVar11 + 1;
          lVar13 = lVar13 + 0x160;
        } while (FVar11 != FVar2);
      }
      if (pFVar4[FVar10].parts != (FmsIOComponentPartInfo *)0x0) {
        free(pFVar4[FVar10].parts);
      }
      if ((pFVar4[FVar10].relation_size != 0) && (pFVar4[FVar10].relation_values != (FmsInt *)0x0))
      {
        free(pFVar4[FVar10].relation_values);
      }
      FVar10 = FVar10 + 1;
    } while (FVar10 != FVar12);
    __ptr = dc_info->mesh_info;
    if (__ptr->components != (FmsIOComponentInfo *)0x0) {
      free(__ptr->components);
      __ptr = dc_info->mesh_info;
    }
  }
  FVar12 = __ptr->ntags;
  if (FVar12 != 0) {
    lVar13 = 0x38;
    do {
      pFVar6 = dc_info->mesh_info->tags;
      pvVar3 = *(void **)((long)pFVar6 + lVar13 + -0x20);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
      }
      pvVar3 = *(void **)((long)pFVar6 + lVar13 + -8);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
      }
      pvVar3 = *(void **)((long)&pFVar6->name + lVar13);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
      }
      lVar13 = lVar13 + 0x40;
      FVar12 = FVar12 - 1;
    } while (FVar12 != 0);
    __ptr = dc_info->mesh_info;
    if (__ptr->tags != (FmsIOTagInfo *)0x0) {
      free(__ptr->tags);
      __ptr = dc_info->mesh_info;
    }
  }
  if (__ptr->partition_info != (FmsInt *)0x0) {
    free(__ptr->partition_info);
    __ptr = dc_info->mesh_info;
    if (__ptr == (FmsIOMeshInfo *)0x0) goto LAB_0010c9d4;
  }
  free(__ptr);
LAB_0010c9d4:
  FVar12 = dc_info->nfds;
  if (FVar12 != 0) {
    lVar13 = 0x18;
    do {
      pvVar3 = *(void **)((long)&dc_info->fds->name + lVar13);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
      }
      lVar13 = lVar13 + 0x28;
      FVar12 = FVar12 - 1;
    } while (FVar12 != 0);
    if (dc_info->fds != (FmsIOFieldDescriptorInfo *)0x0) {
      free(dc_info->fds);
    }
  }
  FVar12 = dc_info->nfields;
  if (FVar12 != 0) {
    lVar13 = 0x38;
    do {
      pFVar7 = dc_info->fields;
      pvVar3 = *(void **)((long)pFVar7 + lVar13 + -8);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
      }
      minfo = *(FmsIOMetaDataInfo **)((long)&pFVar7->name + lVar13);
      if (minfo != (FmsIOMetaDataInfo *)0x0) {
        FmsIODestroyFmsIOMetaDataInfo(minfo);
        pvVar3 = *(void **)((long)&pFVar7->name + lVar13);
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
      }
      lVar13 = lVar13 + 0x40;
      FVar12 = FVar12 - 1;
    } while (FVar12 != 0);
    if (dc_info->fields != (FmsIOFieldInfo *)0x0) {
      free(dc_info->fields);
    }
  }
  if (dc_info->md != (FmsIOMetaDataInfo *)0x0) {
    FmsIODestroyFmsIOMetaDataInfo(dc_info->md);
    if (dc_info->md != (FmsIOMetaDataInfo *)0x0) {
      free(dc_info->md);
    }
  }
  free(dc_info);
  return extraout_EAX;
}

Assistant:

static int
FmsIODestroyFmsIODataCollectionInfo(FmsIODataCollectionInfo *dc_info) {
  if(!dc_info) E_RETURN(1);

  // Destroy DomainNameInfos & DomainInfos
  const FmsInt ndomnames = dc_info->mesh_info->ndomain_names;
  if(ndomnames) {
    FmsInt i;
    for(i = 0; i < ndomnames; i++) {
      FmsInt j;
      FmsInt ndoms = dc_info->mesh_info->domain_names[i].ndomains;
      for(j = 0; j < ndoms; j++) {
        FmsInt k = 0;
        FmsIODomainInfo *dinfo = &dc_info->mesh_info->domain_names[i].domains[j];
        const FmsInt dim = dinfo->dim;
        for(k = 0; k < dim; k++) {
          FmsIOEntityInfo *einfo = &dinfo->entities[k];
          FREE(einfo->values);
          // FREE(einfo); // It's a 1-D array
        }
        FREE(dinfo->entities);
      }
      FREE(dc_info->mesh_info->domain_names[i].domains);
    }
    FREE(dc_info->mesh_info->domain_names);
  }

  // Destroy ComponentInfos
  const FmsInt ncomponents = dc_info->mesh_info->ncomponents;
  if(ncomponents) {
    FmsInt i;
    for(i = 0; i < ncomponents; i++) {
      FmsIOComponentInfo *comp_info = &dc_info->mesh_info->components[i];
      const FmsInt nparts = comp_info->nparts;
      FmsInt j;
      for(j = 0; j < nparts; j++) {
        FmsIOComponentPartInfo *pinfo = &comp_info->parts[j];
        FmsInt k;
        for(k = 0; k < FMS_NUM_ENTITY_TYPES; k++) {
          if(pinfo->entities[k].nents)
            FREE(pinfo->entities[k].values);
        }
      }
      FREE(comp_info->parts);
      // Add the component relations
      const FmsInt nrelations = comp_info->relation_size;
      if(nrelations) {
        FREE(comp_info->relation_values);
      }
    }
    FREE(dc_info->mesh_info->components);
  }

  // Destroy TagInfos
  const FmsInt ntags = dc_info->mesh_info->ntags;
  if(ntags) {
    FmsInt i;
    for(i = 0; i < ntags; i++) {
      FmsIOTagInfo *tinfo = &dc_info->mesh_info->tags[i];
      FREE(tinfo->values);
      FREE(tinfo->tag_values);
      FREE(tinfo->descriptions);
    }
    FREE(dc_info->mesh_info->tags);
  }

  FREE(dc_info->mesh_info->partition_info);
  FREE(dc_info->mesh_info);

  // Add FieldDescriptors
  const FmsInt nfds = dc_info->nfds;
  if(nfds) {
    FmsInt i;
    for(i = 0; i < nfds; i++) {
      FmsIOFieldDescriptorInfo *fd_info = &dc_info->fds[i];
      FREE(fd_info->fixed_order);
    }
    FREE(dc_info->fds);
  }

  const FmsInt nfields = dc_info->nfields;
  if(nfields) {
    FmsInt i;
    for(i = 0; i < nfields; i++) {
      FmsIOFieldInfo *finfo = &dc_info->fields[i];
      FREE(finfo->data);
      if(finfo->md) {
        FmsIODestroyFmsIOMetaDataInfo(finfo->md);
        FREE(finfo->md);
      }
    }
    FREE(dc_info->fields);
  }

  // If we have MetaData destroy it
  if(dc_info->md) {
    FmsIODestroyFmsIOMetaDataInfo(dc_info->md);
    FREE(dc_info->md);
  }

  FREE(dc_info);

  return 0;
}